

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

offset_t LdConfigDirWrapper::_getFieldDelta(bool is32b,size_t fId)

{
  offset_t oVar1;
  offset_t oVar2;
  offset_t oStack_8;
  
  switch(fId) {
  case 0:
    return 0;
  case 1:
    return 4;
  case 2:
    return 8;
  case 3:
    return 10;
  case 4:
    return 0xc;
  case 5:
    return 0x10;
  case 6:
    return 0x14;
  case 7:
    return 0x18;
  case 8:
    return (ulong)!is32b * 4 + 0x1c;
  case 9:
    return (ulong)!is32b * 8 + 0x20;
  case 10:
    oVar2 = 0x24;
    oStack_8 = 0x30;
    oVar1 = oStack_8;
    break;
  case 0xb:
    return (ulong)!is32b << 4 | 0x28;
  case 0xc:
    oVar2 = 0x2c;
    oStack_8 = 0x40;
    oVar1 = oStack_8;
    break;
  case 0xd:
    oVar2 = 0x30;
    oStack_8 = 0x48;
    oVar1 = oStack_8;
    break;
  case 0xe:
    oVar2 = 0x34;
    oStack_8 = 0x4c;
    oVar1 = oStack_8;
    break;
  case 0xf:
    oVar2 = 0x36;
    oStack_8 = 0x4e;
    oVar1 = oStack_8;
    break;
  case 0x10:
    oVar2 = 0x38;
    oStack_8 = 0x50;
    oVar1 = oStack_8;
    break;
  case 0x11:
    oVar2 = 0x3c;
    oStack_8 = 0x58;
    oVar1 = oStack_8;
    break;
  case 0x12:
    return (ulong)!is32b << 5 | 0x40;
  case 0x13:
    oVar2 = 0x44;
    oStack_8 = 0x68;
    oVar1 = oStack_8;
    break;
  case 0x14:
    oVar2 = 0x48;
    oStack_8 = 0x70;
    oVar1 = oStack_8;
    break;
  case 0x15:
    oVar2 = 0x4c;
    oStack_8 = 0x78;
    oVar1 = oStack_8;
    break;
  case 0x16:
    oVar2 = 0x50;
    oVar1 = 0x80;
    break;
  case 0x17:
    oVar2 = 0x54;
    oVar1 = 0x88;
    break;
  case 0x18:
    oVar2 = 0x58;
    oVar1 = 0x90;
    break;
  case 0x19:
    oVar2 = 0x5c;
    oVar1 = 0x94;
    break;
  case 0x1a:
    oVar2 = 0x5e;
    oVar1 = 0x96;
    break;
  case 0x1b:
    oVar2 = 0x60;
    oVar1 = 0x98;
    break;
  case 0x1c:
    oVar2 = 100;
    oVar1 = 0x9c;
    break;
  case 0x1d:
    oStack_8 = 0x68;
    oVar1 = 0xa0;
    oVar2 = oStack_8;
    break;
  case 0x1e:
    oVar1 = 0xa8;
    oVar2 = 0x6c;
    break;
  case 0x1f:
    return (ulong)!is32b * 0x40 + 0x70;
  case 0x20:
    oVar1 = 0xb8;
    oVar2 = 0x74;
    break;
  case 0x21:
    oVar1 = 0xc0;
    oVar2 = 0x78;
    break;
  case 0x22:
    oVar1 = 200;
    oVar2 = 0x7c;
    break;
  case 0x23:
    oVar1 = 0xd0;
    oVar2 = 0x80;
    break;
  case 0x24:
    oVar1 = 0xd8;
    oVar2 = 0x84;
    break;
  case 0x25:
    oVar1 = 0xe0;
    oVar2 = 0x88;
    break;
  case 0x26:
    oVar1 = 0xe4;
    oVar2 = 0x8c;
    break;
  case 0x27:
    oVar1 = 0xe6;
    oVar2 = 0x8e;
    break;
  case 0x28:
    oVar1 = 0xe8;
    oVar2 = 0x90;
    break;
  case 0x29:
    oVar1 = 0xf0;
    oVar2 = 0x94;
    break;
  case 0x2a:
    oVar1 = 0xf4;
    oVar2 = 0x98;
    break;
  case 0x2b:
    oVar1 = 0xf8;
    oVar2 = 0x9c;
    break;
  case 0x2c:
    oVar1 = 0x100;
    oVar2 = 0xa0;
    break;
  case 0x2d:
    oVar1 = 0x108;
    oVar2 = 0xa4;
    break;
  case 0x2e:
    oVar1 = 0x110;
    oVar2 = 0xa8;
    break;
  default:
    return 0xffffffffffffffff;
  }
  if (is32b) {
    oVar1 = oVar2;
  }
  return oVar1;
}

Assistant:

offset_t  LdConfigDirWrapper::_getFieldDelta(bool is32b, size_t fId)
{
    static pe::IMAGE_LOAD_CONFIG_DIRECTORY32 ld32 = { 0 };
    static pe::IMAGE_LOAD_CONFIG_DIRECTORY64 ld64 = { 0 };

    //offset from the beginning of the IMAGE_LOAD_CONFIG_DIRECTORY_T strucure
    offset_t fieldOffset = INVALID_ADDR;
    switch (fId) {
        case SIZE : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, Size) : getStructFieldOffset(ld64, Size);
            break;
        case TIMEST : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32,TimeDateStamp) : getStructFieldOffset(ld64, TimeDateStamp);
            break;
        case MAJOR_VER :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32,MajorVersion) : getStructFieldOffset(ld64, MajorVersion);
            break;
        case MINOR_VER : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, MinorVersion) : getStructFieldOffset(ld64, MinorVersion);
            break;
        case GLOBAL_FLAGS_CLEAR : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GlobalFlagsClear) : getStructFieldOffset(ld64, GlobalFlagsClear);
            break;
        case GLOBAL_FLAGS_SET : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GlobalFlagsSet) : getStructFieldOffset(ld64, GlobalFlagsSet);
            break;
        case CRITICAT_SEC_TIMEOUT : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CriticalSectionDefaultTimeout) : getStructFieldOffset(ld64, CriticalSectionDefaultTimeout);
            break;
        case DECOMMIT_FREE : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DeCommitFreeBlockThreshold) : getStructFieldOffset(ld64, DeCommitFreeBlockThreshold);
            break;

        case DECOMMIT_TOTAL : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DeCommitTotalFreeThreshold) : getStructFieldOffset(ld64, DeCommitTotalFreeThreshold);
            break;
        case LOCK_PREFIX : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, LockPrefixTable) : getStructFieldOffset(ld64, LockPrefixTable);
            break;
        case MAX_ALLOC : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, MaximumAllocationSize) : getStructFieldOffset(ld64, MaximumAllocationSize);
            break;
        case VIRTUAL_MEM : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, VirtualMemoryThreshold) : getStructFieldOffset(ld64, VirtualMemoryThreshold);
            break;
        case PROC_HEAP_FLAGS32 : //PROC_AFF_MASK64
        {
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, ProcessHeapFlags) : getStructFieldOffset(ld64, ProcessAffinityMask);
            break;
        }
        case PROC_AFF_MASK32 : // PROC_HEAP_FLAGS64
        {
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, ProcessAffinityMask) : getStructFieldOffset(ld64, ProcessHeapFlags);
            break;
        }
        case CSD_VER : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CSDVersion) : getStructFieldOffset(ld64, CSDVersion);
            break;
        case DEPENDENT_LOAD_FLAGS : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DependentLoadFlags) : getStructFieldOffset(ld64, DependentLoadFlags);
            break;
        case EDIT_LIST :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, EditList) : getStructFieldOffset(ld64, EditList);
            break;
        case SEC_COOKIE :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, SecurityCookie) : getStructFieldOffset(ld64, SecurityCookie);
            break;
        case SEH_TABLE :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, SEHandlerTable) : getStructFieldOffset(ld64, SEHandlerTable);
            break;
        case SEH_COUNT :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, SEHandlerCount) : getStructFieldOffset(ld64, SEHandlerCount);
            break;

        // W8.1 part:
        case GUARD_CHECK : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFCheckFunctionPointer) : getStructFieldOffset(ld64, GuardCFCheckFunctionPointer);
            break;
        case GUARD_DISPATCH : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFDispatchFunctionPointer) : getStructFieldOffset(ld64, GuardCFDispatchFunctionPointer);
            break;
        case GUARD_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFFunctionTable) : getStructFieldOffset(ld64, GuardCFFunctionTable);
            break;
        case GUARD_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFFunctionCount) : getStructFieldOffset(ld64, GuardCFFunctionCount);
            break;
        case GUARD_FLAGS: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardFlags) : getStructFieldOffset(ld64, GuardFlags);
            break;

        // W10 part:
        case CODE_INTEGRITY_FLAGS: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.Flags) : getStructFieldOffset(ld64, CodeIntegrity.Flags);
            break;
        case CODE_INTEGRITY_CATALOG: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.Catalog) : getStructFieldOffset(ld64, CodeIntegrity.Catalog);
            break;
        case CODE_INTEGRITY_CATALOG_OFFSET:  
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.CatalogOffset) : getStructFieldOffset(ld64, CodeIntegrity.CatalogOffset);
            break;
        case CODE_INTEGRITY_RESERVED: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.Reserved) : getStructFieldOffset(ld64, CodeIntegrity.Reserved);
            break;
        case GUARD_ADDR_IAT_ENTRY_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardAddressTakenIatEntryTable) : getStructFieldOffset(ld64, GuardAddressTakenIatEntryTable);
            break;
        case GUARD_ADDR_IAT_ENTRY_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardAddressTakenIatEntryCount) : getStructFieldOffset(ld64, GuardAddressTakenIatEntryCount);
            break;
        case GUARD_LONG_JUMP_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardLongJumpTargetTable) : getStructFieldOffset(ld64, GuardLongJumpTargetTable);
            break;
        case GUARD_LONG_JUMP_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardLongJumpTargetCount) : getStructFieldOffset(ld64, GuardLongJumpTargetCount);
            break;
        case DYNAMIC_VAL_RELOC:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DynamicValueRelocTable) : getStructFieldOffset(ld64, DynamicValueRelocTable);
            break;
        case CHPE_METADATA_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CHPEMetadataPointer) : getStructFieldOffset(ld64, CHPEMetadataPointer);
            break;
        case GUARD_FAILURE_ROUTINE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardRFFailureRoutine) : getStructFieldOffset(ld64, GuardRFFailureRoutine);
            break;
        case GUARD_FAILURE_ROUTINE_FUNC_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardRFFailureRoutineFunctionPointer) : getStructFieldOffset(ld64, GuardRFFailureRoutineFunctionPointer);
            break;
        case DYNAMIC_VAL_RELOC_TABLE_OFFSET: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DynamicValueRelocTableOffset) : getStructFieldOffset(ld64, DynamicValueRelocTableOffset);
            break;
        case DYNAMIC_VAL_RELOC_TABLE_SECTION:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DynamicValueRelocTableSection) : getStructFieldOffset(ld64, DynamicValueRelocTableSection);
            break;
        case RESERVED2: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, Reserved2) : getStructFieldOffset(ld64, Reserved2);
            break;
        case GUARD_VERIFY_STACK_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardRFVerifyStackPointerFunctionPointer) : getStructFieldOffset(ld64, GuardRFVerifyStackPointerFunctionPointer);
            break;
        case HOT_PATCH_TABLE_OFFSET: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, HotPatchTableOffset) : getStructFieldOffset(ld64, HotPatchTableOffset);
            break;
        case RESERVED3:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, Reserved3) : getStructFieldOffset(ld64, Reserved3);
            break;
        case ENCLAVE_CONFIG_PTR:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, EnclaveConfigurationPointer) : getStructFieldOffset(ld64, EnclaveConfigurationPointer);
            break;
        case VOLATILE_METADATA_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, VolatileMetadataPointer) : getStructFieldOffset(ld64, VolatileMetadataPointer);
            break;
        case GUARD_EH_CONT_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardEHContinuationTable) : getStructFieldOffset(ld64, GuardEHContinuationTable);
            break;
        case GUARD_EH_CONT_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardEHContinuationCount) : getStructFieldOffset(ld64, GuardEHContinuationCount);
            break;
    }
    return fieldOffset;
}